

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qiconloader.cpp
# Opt level: O1

QIconEngine * __thiscall QIconLoader::iconEngine(QIconLoader *this,QString *iconName)

{
  QArrayData *pQVar1;
  Data *pDVar2;
  qsizetype qVar3;
  int *piVar4;
  QPlatformTheme *pQVar5;
  QDebug this_00;
  undefined8 uVar6;
  char cVar7;
  int iVar8;
  QString *pQVar9;
  QHash<QAbstractFileIconProvider::IconType,_QIcon> *pQVar10;
  QIconEnginePlugin *pQVar11;
  QFontIconEngine *pQVar12;
  QString *pQVar13;
  QFontIconEngine *pQVar14;
  QFontIconEngine *pQVar15;
  char16_t *pcVar16;
  pointer __old_p_2;
  pointer __old_p;
  long in_FS_OFFSET;
  QByteArrayView QVar17;
  QByteArrayView QVar18;
  QByteArrayView QVar19;
  QByteArrayView QVar20;
  QByteArrayView QVar21;
  QByteArrayView QVar22;
  QByteArrayView QVar23;
  QByteArrayView QVar24;
  QStringView QVar25;
  QIconEngine local_98;
  undefined1 local_90 [8];
  QDebug local_88;
  QArrayDataPointer<QString> local_80;
  char *local_68;
  QString local_60;
  undefined1 local_48 [16];
  long local_38;
  undefined4 extraout_var;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lcIconLoader();
  if (((byte)lcIconLoader::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0) {
    local_80.d._0_4_ = 2;
    local_80.d._4_4_ = 0;
    local_80.ptr._0_4_ = 0;
    local_80.ptr._4_4_ = 0;
    local_80.size._0_4_ = 0;
    local_80.size._4_4_ = 0;
    local_68 = lcIconLoader::category.name;
    QMessageLogger::debug();
    uVar6 = local_48._0_8_;
    QVar17.m_data = (storage_type *)0x1e;
    QVar17.m_size = (qsizetype)&local_60;
    QString::fromUtf8(QVar17);
    QTextStream::operator<<((QTextStream *)uVar6,&local_60);
    if (&(local_60.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_60.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (*(QTextStream *)(local_48._0_8_ + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_48._0_8_,' ');
    }
    pcVar16 = (iconName->d).ptr;
    if (pcVar16 == (char16_t *)0x0) {
      pcVar16 = (char16_t *)&QString::_empty;
    }
    QDebug::putString((QChar *)local_48,(ulong)pcVar16);
    if (*(QTextStream *)(local_48._0_8_ + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_48._0_8_,' ');
    }
    QDebug::~QDebug((QDebug *)local_48);
  }
  if ((this->m_factory).super__Optional_base<QIconEnginePlugin_*,_true,_true>._M_payload.
      super__Optional_payload_base<QIconEnginePlugin_*>._M_engaged == false) {
    lcIconLoader();
    if (((byte)lcIconLoader::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0) {
      local_80.d._0_4_ = 2;
      local_80.d._4_4_ = 0;
      local_80.ptr._0_4_ = 0;
      local_80.ptr._4_4_ = 0;
      local_80.size._0_4_ = 0;
      local_80.size._4_4_ = 0;
      local_68 = lcIconLoader::category.name;
      QMessageLogger::debug();
      uVar6 = local_48._0_8_;
      QVar18.m_data = (storage_type *)0x1a;
      QVar18.m_size = (qsizetype)&local_60;
      QString::fromUtf8(QVar18);
      QTextStream::operator<<((QTextStream *)uVar6,&local_60);
      if (&(local_60.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_60.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (*(QTextStream *)(local_48._0_8_ + 0x30) == (QTextStream)0x1) {
        QTextStream::operator<<((QTextStream *)local_48._0_8_,' ');
      }
      pQVar13 = &this->m_userTheme;
      if ((this->m_userTheme).d.size == 0) {
        pQVar13 = &this->m_systemTheme;
      }
      pQVar1 = &((pQVar13->d).d)->super_QArrayData;
      pcVar16 = (pQVar13->d).ptr;
      if (pQVar1 != (QArrayData *)0x0) {
        LOCK();
        (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      if (pcVar16 == (char16_t *)0x0) {
        pcVar16 = (char16_t *)&QString::_empty;
      }
      QDebug::putString((QChar *)local_48,(ulong)pcVar16);
      if (*(QTextStream *)(local_48._0_8_ + 0x30) == (QTextStream)0x1) {
        QTextStream::operator<<((QTextStream *)local_48._0_8_,' ');
      }
      if (pQVar1 != (QArrayData *)0x0) {
        LOCK();
        (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar1,2,0x10);
        }
      }
      QDebug::~QDebug((QDebug *)local_48);
    }
    pQVar9 = (QString *)qt_iconEngineFactoryLoader();
    pQVar13 = &this->m_userTheme;
    if ((this->m_userTheme).d.size == 0) {
      pQVar13 = &this->m_systemTheme;
    }
    pDVar2 = (pQVar13->d).d;
    local_80.d._0_4_ = SUB84(pDVar2,0);
    local_80.d._4_4_ = (undefined4)((ulong)pDVar2 >> 0x20);
    pcVar16 = (pQVar13->d).ptr;
    local_80.ptr._0_4_ = SUB84(pcVar16,0);
    local_80.ptr._4_4_ = (undefined4)((ulong)pcVar16 >> 0x20);
    qVar3 = (pQVar13->d).size;
    local_80.size._0_4_ = (undefined4)qVar3;
    local_80.size._4_4_ = (undefined4)((ulong)qVar3 >> 0x20);
    if (pDVar2 != (Data *)0x0) {
      LOCK();
      (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    iVar8 = QFactoryLoader::indexOf(pQVar9);
    piVar4 = (int *)CONCAT44(local_80.d._4_4_,local_80.d._0_4_);
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + -1;
      UNLOCK();
      if (*piVar4 == 0) {
        QArrayData::deallocate((QArrayData *)CONCAT44(local_80.d._4_4_,local_80.d._0_4_),2,0x10);
      }
    }
    if (-1 < iVar8) {
      pQVar10 = qt_iconEngineFactoryLoader();
      QFactoryLoader::instance((int)pQVar10);
      pQVar11 = (QIconEnginePlugin *)
                QMetaObject::cast((QObject *)&QIconEnginePlugin::staticMetaObject);
      (this->m_factory).super__Optional_base<QIconEnginePlugin_*,_true,_true>._M_payload.
      super__Optional_payload_base<QIconEnginePlugin_*>._M_payload._M_value = pQVar11;
      (this->m_factory).super__Optional_base<QIconEnginePlugin_*,_true,_true>._M_payload.
      super__Optional_payload_base<QIconEnginePlugin_*>._M_engaged = true;
    }
  }
  if (((this->m_factory).super__Optional_base<QIconEnginePlugin_*,_true,_true>._M_payload.
       super__Optional_payload_base<QIconEnginePlugin_*>._M_engaged == true) &&
     (pQVar11 = (this->m_factory).super__Optional_base<QIconEnginePlugin_*,_true,_true>._M_payload.
                super__Optional_payload_base<QIconEnginePlugin_*>._M_payload._M_value,
     pQVar11 != (QIconEnginePlugin *)0x0)) {
    pQVar12 = (QFontIconEngine *)(**(code **)(*(long *)pQVar11 + 0x60))();
  }
  else {
    pQVar12 = (QFontIconEngine *)0x0;
  }
  pQVar14 = pQVar12;
  if ((this->m_userTheme).d.size != 0) {
    if ((pQVar12 == (QFontIconEngine *)0x0) ||
       (iVar8 = (*(pQVar12->super_QIconEngine)._vptr_QIconEngine[0xd])(pQVar12), (char)iVar8 != '\0'
       )) {
      QFontDatabase::families((QStringList *)&local_80,Any);
      pQVar13 = &this->m_userTheme;
      if ((this->m_userTheme).d.size == 0) {
        pQVar13 = &this->m_systemTheme;
      }
      pQVar1 = &((pQVar13->d).d)->super_QArrayData;
      pcVar16 = (pQVar13->d).ptr;
      qVar3 = (pQVar13->d).size;
      if (pQVar1 != (QArrayData *)0x0) {
        LOCK();
        (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      QVar25.m_data = pcVar16;
      QVar25.m_size = qVar3;
      cVar7 = QtPrivate::QStringList_contains((QList_conflict *)&local_80,QVar25,CaseSensitive);
      if (pQVar1 != (QArrayData *)0x0) {
        LOCK();
        (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar1,2,0x10);
        }
      }
      QArrayDataPointer<QString>::~QArrayDataPointer(&local_80);
      if (cVar7 != '\0') {
        local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        pQVar13 = &this->m_userTheme;
        if ((this->m_userTheme).d.size == 0) {
          pQVar13 = &this->m_systemTheme;
        }
        pDVar2 = (pQVar13->d).d;
        local_80.d._0_4_ = SUB84(pDVar2,0);
        local_80.d._4_4_ = (undefined4)((ulong)pDVar2 >> 0x20);
        pcVar16 = (pQVar13->d).ptr;
        local_80.ptr._0_4_ = SUB84(pcVar16,0);
        local_80.ptr._4_4_ = (undefined4)((ulong)pcVar16 >> 0x20);
        qVar3 = (pQVar13->d).size;
        local_80.size._0_4_ = (undefined4)qVar3;
        local_80.size._4_4_ = (undefined4)((ulong)qVar3 >> 0x20);
        if (pDVar2 != (Data *)0x0) {
          LOCK();
          (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        QFont::QFont((QFont *)local_48,(QString *)&local_80,-1,-1,false);
        piVar4 = (int *)CONCAT44(local_80.d._4_4_,local_80.d._0_4_);
        if (piVar4 != (int *)0x0) {
          LOCK();
          *piVar4 = *piVar4 + -1;
          UNLOCK();
          if (*piVar4 == 0) {
            QArrayData::deallocate((QArrayData *)CONCAT44(local_80.d._4_4_,local_80.d._0_4_),2,0x10)
            ;
          }
        }
        QFont::setStyleStrategy((QFont *)local_48,NoFontMerging);
        lcIconLoader();
        if (((byte)lcIconLoader::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0
           ) {
          local_80.d._0_4_ = 2;
          local_80.d._4_4_ = 0;
          local_80.ptr._0_4_ = 0;
          local_80.ptr._4_4_ = 0;
          local_80.size._0_4_ = 0;
          local_80.size._4_4_ = 0;
          local_68 = lcIconLoader::category.name;
          QMessageLogger::debug();
          this_00.stream = local_88.stream;
          QVar19.m_data = (storage_type *)0x18;
          QVar19.m_size = (qsizetype)&local_60;
          QString::fromUtf8(QVar19);
          QTextStream::operator<<(&(this_00.stream)->ts,&local_60);
          if (&(local_60.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_60.d.d)->super_QArrayData,2,0x10);
            }
          }
          if ((local_88.stream)->space == true) {
            QTextStream::operator<<(&(local_88.stream)->ts,' ');
          }
          QDebug::~QDebug(&local_88);
        }
        pQVar14 = (QFontIconEngine *)operator_new(0x58);
        QFontIconEngine::QFontIconEngine(pQVar14,iconName,(QFont *)local_48);
        if (pQVar12 != (QFontIconEngine *)0x0) {
          (*(pQVar12->super_QIconEngine)._vptr_QIconEngine[1])(pQVar12);
        }
        QFont::~QFont((QFont *)local_48);
        pQVar12 = pQVar14;
      }
    }
    if ((pQVar12 == (QFontIconEngine *)0x0) ||
       (iVar8 = (*(pQVar12->super_QIconEngine)._vptr_QIconEngine[0xd])(pQVar12), pQVar14 = pQVar12,
       (char)iVar8 != '\0')) {
      lcIconLoader();
      if (((byte)lcIconLoader::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0)
      {
        local_80.d._0_4_ = 2;
        local_80.d._4_4_ = 0;
        local_80.ptr._0_4_ = 0;
        local_80.ptr._4_4_ = 0;
        local_80.size._0_4_ = 0;
        local_80.size._4_4_ = 0;
        local_68 = lcIconLoader::category.name;
        QMessageLogger::debug();
        uVar6 = local_48._0_8_;
        QVar20.m_data = (storage_type *)0x1f;
        QVar20.m_size = (qsizetype)&local_60;
        QString::fromUtf8(QVar20);
        QTextStream::operator<<((QTextStream *)uVar6,&local_60);
        if (&(local_60.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_60.d.d)->super_QArrayData,2,0x10);
          }
        }
        if (*(QTextStream *)(local_48._0_8_ + 0x30) == (QTextStream)0x1) {
          QTextStream::operator<<((QTextStream *)local_48._0_8_,' ');
        }
        QDebug::~QDebug((QDebug *)local_48);
      }
      pQVar14 = (QFontIconEngine *)operator_new(0x50);
      QIconLoaderEngine::QIconLoaderEngine((QIconLoaderEngine *)pQVar14,iconName);
      if (pQVar12 != (QFontIconEngine *)0x0) {
        (*(pQVar12->super_QIconEngine)._vptr_QIconEngine[1])(pQVar12);
      }
    }
  }
  if ((pQVar14 == (QFontIconEngine *)0x0) ||
     (iVar8 = (*(pQVar14->super_QIconEngine)._vptr_QIconEngine[0xd])(pQVar14), (char)iVar8 != '\0'))
  {
    lcIconLoader();
    if (((byte)lcIconLoader::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0) {
      local_80.d._0_4_ = 2;
      local_80.d._4_4_ = 0;
      local_80.ptr._0_4_ = 0;
      local_80.ptr._4_4_ = 0;
      local_80.size._0_4_ = 0;
      local_80.size._4_4_ = 0;
      local_68 = lcIconLoader::category.name;
      QMessageLogger::debug();
      uVar6 = local_48._0_8_;
      QVar21.m_data = (storage_type *)0x33;
      QVar21.m_size = (qsizetype)&local_60;
      QString::fromUtf8(QVar21);
      QTextStream::operator<<((QTextStream *)uVar6,&local_60);
      if (&(local_60.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_60.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (*(QTextStream *)(local_48._0_8_ + 0x30) == (QTextStream)0x1) {
        QTextStream::operator<<((QTextStream *)local_48._0_8_,' ');
      }
      QDebug::~QDebug((QDebug *)local_48);
    }
    pQVar5 = QGuiApplicationPrivate::platform_theme;
    if (QGuiApplicationPrivate::platform_theme != (QPlatformTheme *)0x0) {
      lcIconLoader();
      if (((byte)lcIconLoader::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0)
      {
        local_80.d._0_4_ = 2;
        local_80.d._4_4_ = 0;
        local_80.ptr._0_4_ = 0;
        local_80.ptr._4_4_ = 0;
        local_80.size._0_4_ = 0;
        local_80.size._4_4_ = 0;
        local_68 = lcIconLoader::category.name;
        QMessageLogger::debug();
        uVar6 = local_48._0_8_;
        QVar22.m_data = (storage_type *)0x17;
        QVar22.m_size = (qsizetype)&local_60;
        QString::fromUtf8(QVar22);
        QTextStream::operator<<((QTextStream *)uVar6,&local_60);
        if (&(local_60.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_60.d.d)->super_QArrayData,2,0x10);
          }
        }
        if (*(QTextStream *)(local_48._0_8_ + 0x30) == (QTextStream)0x1) {
          QTextStream::operator<<((QTextStream *)local_48._0_8_,' ');
        }
        QDebug::~QDebug((QDebug *)local_48);
      }
      iVar8 = (*pQVar5->_vptr_QPlatformTheme[0xf])(pQVar5,iconName);
      pQVar15 = (QFontIconEngine *)CONCAT44(extraout_var,iVar8);
      pQVar12 = pQVar15;
      if ((pQVar15 != (QFontIconEngine *)0x0) &&
         (iVar8 = (*(pQVar15->super_QIconEngine)._vptr_QIconEngine[0xd])(), (char)iVar8 == '\0')) {
        if (pQVar14 != (QFontIconEngine *)0x0) {
          (*(pQVar14->super_QIconEngine)._vptr_QIconEngine[1])();
        }
        lcIconLoader();
        if (((byte)lcIconLoader::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0
           ) {
          local_80.d._0_4_ = 2;
          local_80.d._4_4_ = 0;
          local_80.ptr._0_4_ = 0;
          local_80.ptr._4_4_ = 0;
          local_80.size._0_4_ = 0;
          local_80.size._4_4_ = 0;
          local_68 = lcIconLoader::category.name;
          QMessageLogger::debug();
          uVar6 = local_48._0_8_;
          QVar23.m_data = (storage_type *)0x21;
          QVar23.m_size = (qsizetype)&local_60;
          QString::fromUtf8(QVar23);
          QTextStream::operator<<((QTextStream *)uVar6,&local_60);
          if (&(local_60.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_60.d.d)->super_QArrayData,2,0x10);
            }
          }
          if (*(QTextStream *)(local_48._0_8_ + 0x30) == (QTextStream)0x1) {
            QTextStream::operator<<((QTextStream *)local_48._0_8_,' ');
          }
          QDebug::~QDebug((QDebug *)local_48);
        }
        pQVar12 = (QFontIconEngine *)0x0;
        pQVar14 = pQVar15;
      }
      if (pQVar12 != (QFontIconEngine *)0x0) {
        (*(pQVar12->super_QIconEngine)._vptr_QIconEngine[1])();
      }
    }
  }
  if (pQVar14 == (QFontIconEngine *)0x0) {
    pQVar14 = (QFontIconEngine *)operator_new(0x50);
    QIconLoaderEngine::QIconLoaderEngine((QIconLoaderEngine *)pQVar14,iconName);
  }
  lcIconLoader();
  if (((byte)lcIconLoader::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0) {
    local_80.d._0_4_ = 2;
    local_80.d._4_4_ = 0;
    local_80.ptr._0_4_ = 0;
    local_80.ptr._4_4_ = 0;
    local_80.size._0_4_ = 0;
    local_80.size._4_4_ = 0;
    local_68 = lcIconLoader::category.name;
    QMessageLogger::debug();
    uVar6 = local_48._0_8_;
    QVar24.m_data = (storage_type *)0x10;
    QVar24.m_size = (qsizetype)&local_60;
    QString::fromUtf8(QVar24);
    QTextStream::operator<<((QTextStream *)uVar6,&local_60);
    if (&(local_60.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_60.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (*(QTextStream *)(local_48._0_8_ + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_48._0_8_,' ');
    }
    local_98._vptr_QIconEngine = (_func_int **)local_48._0_8_;
    *(int *)(local_48._0_8_ + 0x28) = *(int *)(local_48._0_8_ + 0x28) + 1;
    ::operator<<((Stream *)local_90,&local_98);
    QDebug::~QDebug((QDebug *)local_90);
    QDebug::~QDebug((QDebug *)&local_98);
    QDebug::~QDebug((QDebug *)local_48);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return &pQVar14->super_QIconEngine;
}

Assistant:

QIconEngine *QIconLoader::iconEngine(const QString &iconName) const
{
    qCDebug(lcIconLoader) << "Resolving icon engine for icon" << iconName;

    std::unique_ptr<QIconEngine> iconEngine;

    if (!m_factory) {
        qCDebug(lcIconLoader) << "Finding a plugin for theme" << themeName();
        // try to find a plugin that supports the current theme
        const int factoryIndex = qt_iconEngineFactoryLoader()->indexOf(themeName());
        if (factoryIndex >= 0)
            m_factory = qobject_cast<QIconEnginePlugin *>(qt_iconEngineFactoryLoader()->instance(factoryIndex));
    }
    if (m_factory && *m_factory)
        iconEngine.reset(m_factory.value()->create(iconName));

    if (hasUserTheme()) {
        if (!iconEngine || iconEngine->isNull()) {
            if (QFontDatabase::families().contains(themeName())) {
                QFont maybeIconFont(themeName());
                maybeIconFont.setStyleStrategy(QFont::NoFontMerging);
                qCDebug(lcIconLoader) << "Trying font icon engine.";
                iconEngine.reset(new QFontIconEngine(iconName, maybeIconFont));
            }
        }
        if (!iconEngine || iconEngine->isNull()) {
            qCDebug(lcIconLoader) << "Trying loader engine for theme.";
            iconEngine.reset(new QIconLoaderEngine(iconName));
        }
    }

    if (!iconEngine || iconEngine->isNull()) {
        qCDebug(lcIconLoader) << "Icon is not available from theme or fallback theme.";
        if (auto *platformTheme = QGuiApplicationPrivate::platformTheme()) {
            qCDebug(lcIconLoader) << "Trying platform engine.";
            std::unique_ptr<QIconEngine> themeEngine(platformTheme->createIconEngine(iconName));
            if (themeEngine && !themeEngine->isNull()) {
                iconEngine = std::move(themeEngine);
                qCDebug(lcIconLoader) << "Icon provided by platform engine.";
            }
        }
    }
    // We need to maintain the invariant that the QIcon has a valid engine
    if (!iconEngine)
        iconEngine.reset(new QIconLoaderEngine(iconName));

    qCDebug(lcIconLoader) << "Resulting engine" << iconEngine.get();
    return iconEngine.release();
}